

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_resource_array_size(CompilerMSL *this,SPIRType *type,uint32_t id)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  pointer pvVar3;
  uint32_t local_5c;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  local_48;
  const_iterator itr;
  StageSetBinding tuple;
  uint32_t desc_set;
  uint32_t array_size;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  local_5c = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&tuple.desc_set,id);
  tuple.binding =
       Compiler::get_decoration((Compiler *)this,(ID)tuple.desc_set,DecorationDescriptorSet);
  bVar1 = descriptor_set_is_argument_buffer(this,tuple.binding);
  if ((bVar1) || (this_local._4_4_ = local_5c, local_5c == 0)) {
    pSVar2 = Compiler::get_entry_point((Compiler *)this);
    itr.
    super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
    ._M_cur._4_4_ = pSVar2->model;
    TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&itr,id);
    tuple.model = Compiler::get_decoration
                            ((Compiler *)this,
                             itr.
                             super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                             ._M_cur._0_4_,DecorationBinding);
    local_48._M_cur =
         (__node_type *)
         ::std::
         unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>_>
         ::find(&this->resource_bindings,
                (key_type *)
                ((long)&itr.
                        super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                        ._M_cur + 4));
    local_50._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<spirv_cross::StageSetBinding,std::pair<spirv_cross::MSLResourceBinding,bool>,spirv_cross::InternalHasher,std::equal_to<spirv_cross::StageSetBinding>,std::allocator<std::pair<spirv_cross::StageSetBinding_const,std::pair<spirv_cross::MSLResourceBinding,bool>>>>>
                   (&this->resource_bindings);
    bVar1 = ::std::__detail::operator!=(&local_48,&local_50);
    if (bVar1) {
      pvVar3 = ::std::__detail::
               _Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
                             *)&local_48);
      local_5c = (pvVar3->second).first.count;
    }
    this_local._4_4_ = local_5c;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_resource_array_size(const SPIRType &type, uint32_t id) const
{
	uint32_t array_size = to_array_size_literal(type);

	// If we have argument buffers, we need to honor the ABI by using the correct array size
	// from the layout. Only use shader declared size if we're not using argument buffers.
	uint32_t desc_set = get_decoration(id, DecorationDescriptorSet);
	if (!descriptor_set_is_argument_buffer(desc_set) && array_size)
		return array_size;

	StageSetBinding tuple = { get_entry_point().model, desc_set,
		                      get_decoration(id, DecorationBinding) };
	auto itr = resource_bindings.find(tuple);
	return itr != end(resource_bindings) ? itr->second.first.count : array_size;
}